

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.cpp
# Opt level: O3

double __thiscall entropy::calcEntropy(entropy *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double __x;
  
  iVar2 = this->n;
  dVar7 = log((double)iVar2);
  dVar7 = dVar7 * (double)iVar2;
  iVar2 = this->position_box_count;
  if (0 < iVar2) {
    lVar3 = 0;
    do {
      if (0 < iVar2) {
        iVar1 = this->velocity_box_count;
        lVar5 = 0;
        do {
          if (0 < iVar1) {
            lVar4 = 0;
            do {
              if (0 < iVar1) {
                lVar6 = 0;
                do {
                  iVar2 = *(int *)(*(long *)(*(long *)(*(long *)&(this->boxes).
                                                                                                                                  
                                                  super__Vector_base<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar3].
                                                  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                                  ._M_impl + lVar5 * 0x18) + lVar4 * 0x18) +
                                  lVar6 * 4);
                  if (0 < iVar2) {
                    __x = (double)iVar2;
                    dVar8 = log(__x);
                    dVar7 = dVar7 - dVar8 * __x;
                    iVar1 = this->velocity_box_count;
                  }
                  lVar6 = lVar6 + 1;
                } while (lVar6 < iVar1);
              }
              lVar4 = lVar4 + 1;
            } while (lVar4 < iVar1);
            iVar2 = this->position_box_count;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar2);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar2);
  }
  return dVar7;
}

Assistant:

double entropy::calcEntropy()
{
    //int n = particles.size();
    int ns = 0;
    double res = n * log(n);
    for (int i = 0; i < position_box_count; i++)
    {
        for (int j = 0; j < position_box_count; j++)
        {
            for (int k = 0; k < velocity_box_count; k++)
            {
                for (int l = 0; l < velocity_box_count; l++)
                {
                    ns = boxes[i][j][k][l];
                    if (ns > 0)
                    {
                        res -= ns * log(ns);
                    }
                }
            }
        }
    }
    return res;
}